

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.h
# Opt level: O0

void util::Xor(Span<std::byte> write,Span<const_std::byte> key,size_t key_offset)

{
  long lVar1;
  size_t sVar2;
  byte *pbVar3;
  Span<const_std::byte> *pSVar4;
  ulong in_R8;
  long in_FS_OFFSET;
  size_t j;
  size_t i;
  Span<std::byte> *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  byte in_stack_ffffffffffffff97;
  Span<const_std::byte> *in_stack_ffffffffffffff98;
  Span<const_std::byte> *local_58;
  size_t local_50;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  sVar2 = Span<const_std::byte>::size((Span<const_std::byte> *)in_stack_ffffffffffffff88);
  if (sVar2 != 0) {
    sVar2 = Span<const_std::byte>::size((Span<const_std::byte> *)in_stack_ffffffffffffff88);
    local_58 = (Span<const_std::byte> *)(in_R8 % sVar2);
    for (local_50 = 0; sVar2 = Span<std::byte>::size(in_stack_ffffffffffffff88), local_50 != sVar2;
        local_50 = local_50 + 1) {
      local_58 = (Span<const_std::byte> *)((long)&local_58->m_data + 1);
      pbVar3 = Span<const_std::byte>::operator[]
                         (in_stack_ffffffffffffff98,
                          CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
      in_stack_ffffffffffffff97 = *pbVar3;
      pbVar3 = Span<std::byte>::operator[]
                         ((Span<std::byte> *)in_stack_ffffffffffffff98,
                          CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
      *pbVar3 = *pbVar3 ^ in_stack_ffffffffffffff97;
      in_stack_ffffffffffffff98 = local_58;
      pSVar4 = (Span<const_std::byte> *)
               Span<const_std::byte>::size((Span<const_std::byte> *)in_stack_ffffffffffffff88);
      if (in_stack_ffffffffffffff98 == pSVar4) {
        local_58 = (Span<const_std::byte> *)0x0;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

inline void Xor(Span<std::byte> write, Span<const std::byte> key, size_t key_offset = 0)
{
    if (key.size() == 0) {
        return;
    }
    key_offset %= key.size();

    for (size_t i = 0, j = key_offset; i != write.size(); i++) {
        write[i] ^= key[j++];

        // This potentially acts on very many bytes of data, so it's
        // important that we calculate `j`, i.e. the `key` index in this
        // way instead of doing a %, which would effectively be a division
        // for each byte Xor'd -- much slower than need be.
        if (j == key.size())
            j = 0;
    }
}